

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuleParser.cpp
# Opt level: O3

bool __thiscall Refal2::CRuleParser::BeginRule(CRuleParser *this)

{
  TTokenType TVar1;
  string local_40;
  
  TVar1 = (this->functionName).type;
  (this->super_CQualifierParser).super_CParsingElementState.state = PES_NotFinished;
  if (TVar1 == TT_None) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"try to define rule out of function","");
    error(this,&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p);
    }
  }
  else {
    this->state = (TState)direction;
    *(undefined8 *)&this->field_0x1e80 = 0;
  }
  return TVar1 != TT_None;
}

Assistant:

bool CRuleParser::BeginRule()
{
	if( !functionName.IsNone() ) {
		beginRule();
		return true;
	}
	CParsingElementState::Reset();
	error( "try to define rule out of function" );
	return false;
}